

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var * __thiscall cs::structure::get_var<cs::var_id_const&>(structure *this,var_id *name)

{
  bool bVar1;
  var *pvVar2;
  string *str;
  string *psVar3;
  var_id *in_RSI;
  domain_type *in_RDI;
  var_id *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar4;
  domain_type *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e656d);
  bVar1 = domain_type::exist(in_RDI,in_stack_ffffffffffffff28);
  if (!bVar1) {
    uVar4 = 1;
    str = (string *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,in_stack_ffffffffffffff38),(char *)in_RDI);
    psVar3 = var_id::operator_cast_to_string_(in_RSI);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff40,(string *)psVar3);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,in_stack_ffffffffffffff38),(char *)in_RDI);
    runtime_error::runtime_error((runtime_error *)in_RDI,str);
    __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e6591);
  pvVar2 = domain_type::get_var_no_check
                     (in_stack_ffffffffffffff40,
                      (var_id *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  return pvVar2;
}

Assistant:

var &get_var(T &&name) const
		{
			if (m_data->exist(name))
				return m_data->get_var_no_check(name);
			else
				throw runtime_error("Struct \"" + m_name + "\" have no member called \"" + std::string(name) + "\".");
		}